

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O2

void expand_list(dmr_C *C,token **list)

{
  int iVar1;
  token *ptVar2;
  dmr_C *C_00;
  
  C_00 = (dmr_C *)list;
LAB_0011d8d4:
  ptVar2 = scan_next(C_00,list);
  if (ptVar2 == &dmrC_eof_token_entry_) {
    return;
  }
  if (((ulong)ptVar2->pos & 0x3f) == 2) goto code_r0x0011d8ee;
  goto LAB_0011d8fd;
code_r0x0011d8ee:
  list = (token **)C_00;
  iVar1 = expand_one_symbol(C,(token **)C_00);
  if (iVar1 != 0) {
LAB_0011d8fd:
    C_00 = (dmr_C *)&ptVar2->next;
  }
  goto LAB_0011d8d4;
}

Assistant:

static void expand_list(struct dmr_C *C, struct token **list)
{
	struct token *next;
	while (!dmrC_eof_token(next = scan_next(C, list))) {
		if (dmrC_token_type(next) != TOKEN_IDENT || expand_one_symbol(C, list))
			list = &next->next;
	}
}